

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int *piVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  float *__dest;
  unsigned_short *__dest_00;
  int iVar7;
  long lVar8;
  long lVar9;
  
  pIVar5 = GImGui;
  iVar2 = (this->IndexLookup).Size;
  lVar9 = (long)iVar2;
  if ((this->IndexXAdvance).Size != iVar2) {
    __assert_fail("IndexXAdvance.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x6d8,"void ImFont::GrowIndex(int)");
  }
  if (iVar2 < new_size) {
    iVar6 = (this->IndexXAdvance).Capacity;
    if (iVar6 < new_size) {
      if (iVar6 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar6 / 2 + iVar6;
      }
      if (iVar7 <= new_size) {
        iVar7 = new_size;
      }
      if (iVar6 < iVar7) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (float *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 << 2);
        pfVar3 = (this->IndexXAdvance).Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(__dest,pfVar3,(long)(this->IndexXAdvance).Size << 2);
        }
        pfVar3 = (this->IndexXAdvance).Data;
        if (pfVar3 != (float *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pfVar3);
        (this->IndexXAdvance).Data = __dest;
        (this->IndexXAdvance).Capacity = iVar7;
      }
    }
    (this->IndexXAdvance).Size = new_size;
    pIVar5 = GImGui;
    iVar6 = (this->IndexLookup).Capacity;
    if (iVar6 < new_size) {
      if (iVar6 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar6 / 2 + iVar6;
      }
      if (iVar7 <= new_size) {
        iVar7 = new_size;
      }
      if (iVar6 < iVar7) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest_00 = (unsigned_short *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 * 2);
        puVar4 = (this->IndexLookup).Data;
        if (puVar4 != (unsigned_short *)0x0) {
          memcpy(__dest_00,puVar4,(long)(this->IndexLookup).Size * 2);
        }
        puVar4 = (this->IndexLookup).Data;
        if (puVar4 != (unsigned_short *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(puVar4);
        (this->IndexLookup).Data = __dest_00;
        (this->IndexLookup).Capacity = iVar7;
      }
    }
    (this->IndexLookup).Size = new_size;
    if (iVar2 < new_size) {
      iVar6 = (this->IndexXAdvance).Size;
      if (iVar6 < iVar2) {
        iVar6 = iVar2;
      }
      pfVar3 = (this->IndexXAdvance).Data;
      puVar4 = (this->IndexLookup).Data;
      lVar8 = 0;
      do {
        if (iVar6 - lVar9 == lVar8) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,"value_type &ImVector<float>::operator[](int) [T = float]");
        }
        pfVar3[lVar9 + lVar8] = -1.0;
        puVar4[lVar9 + lVar8] = 0xffff;
        lVar8 = lVar8 + 1;
      } while (new_size - iVar2 != (int)lVar8);
    }
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexXAdvance.Size == IndexLookup.Size);
    int old_size = IndexLookup.Size;
    if (new_size <= old_size)
        return;
    IndexXAdvance.resize(new_size);
    IndexLookup.resize(new_size);
    for (int i = old_size; i < new_size; i++)
    {
        IndexXAdvance[i] = -1.0f;
        IndexLookup[i] = (unsigned short)-1;
    }
}